

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_move_8_aw_d(void)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  
  bVar1 = (byte)m68ki_cpu.dar[m68ki_cpu.ir & 7];
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar3 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar3 = pmmu_translate_addr(uVar3);
  }
  uVar2 = m68k_read_memory_16(uVar3 & m68ki_cpu.address_mask);
  uVar3 = (uint)(short)uVar2;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar3 = pmmu_translate_addr(uVar3);
  }
  m68k_write_memory_8(uVar3 & m68ki_cpu.address_mask,(uint)bVar1);
  m68ki_cpu.n_flag = (uint)bVar1;
  m68ki_cpu.not_z_flag = (uint)bVar1;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_8_aw_d(void)
{
	uint res = MASK_OUT_ABOVE_8(DY);
	uint ea = EA_AW_8();

	m68ki_write_8(ea, res);

	FLAG_N = NFLAG_8(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}